

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall pbrt::ThreadPool::ForEachThread(ThreadPool *this,function<void_()> *func)

{
  Barrier *this_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = (Barrier *)operator_new(0x60);
  Barrier::Barrier(this_00,(int)((ulong)((long)(this->threads).
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->threads).
                                              super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
  local_20 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp:178:40)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp:178:40)>
             ::_M_manager;
  local_38._M_unused._M_object = this_00;
  local_38._8_8_ = func;
  ParallelFor(0,((long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) + 1,
              (function<void_(long)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void ThreadPool::ForEachThread(std::function<void(void)> func) {
    Barrier *barrier = new Barrier(threads.size() + 1);

    ParallelFor(0, threads.size() + 1, [barrier, &func](int64_t) {
        func();
        if (barrier->Block())
            delete barrier;
    });
}